

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void vkt::Draw::populateSubGroup(TestCaseGroup *testGroup,TestCaseParams caseParams)

{
  TestContext *pTVar1;
  undefined8 uVar2;
  deUint32 dVar3;
  char *pcVar4;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawParams> *this;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this_00;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *pDVar5;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *pDVar6;
  DrawIndexedIndirectParams local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f1;
  DrawIndexedIndirectParams local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  DrawIndexedIndirectParams params_1;
  deUint32 vertexOffset_1;
  deUint32 firstIndex_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b1;
  DrawIndirectParams local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  DrawIndirectParams params;
  deUint32 firstVertex_1;
  int local_c4;
  deUint32 local_c0;
  deUint32 vertexOffset;
  deUint32 firstIndex;
  deUint32 local_84;
  int local_80;
  deUint32 firstVertex;
  deUint32 firstPrimitive;
  undefined1 local_70 [8];
  string name;
  int local_48;
  deUint32 vertexCount;
  deUint32 offset;
  deUint32 multiplier;
  deUint32 primitives;
  deUint32 primitiveCountIdx;
  VkPrimitiveTopology topology;
  DrawCommandType command;
  TestContext *testCtx;
  Random rnd;
  TestCaseGroup *testGroup_local;
  TestCaseParams caseParams_local;
  
  rnd.m_rnd._8_8_ = testGroup;
  pcVar4 = tcu::TestNode::getName(&testGroup->super_TestNode);
  dVar3 = deStringHash(pcVar4);
  de::Random::Random((Random *)&testCtx,dVar3 ^ 0xc2a39f);
  _topology = tcu::TestNode::getTestContext((TestNode *)rnd.m_rnd._8_8_);
  testGroup_local._0_4_ = caseParams.command;
  primitiveCountIdx = (DrawCommandType)testGroup_local;
  testGroup_local._4_4_ = caseParams.topology;
  primitives = testGroup_local._4_4_;
  for (multiplier = 0; multiplier < 4; multiplier = multiplier + 1) {
    offset = *(deUint32 *)((anonymous_namespace)::PRIMITIVE_COUNT + (ulong)multiplier * 4);
    vertexCount = 1;
    local_48 = 0;
    switch(primitives) {
    case 0:
      break;
    case 1:
      vertexCount = 2;
      break;
    case 2:
      break;
    case 3:
      vertexCount = 3;
      break;
    case 4:
      break;
    case 5:
      local_48 = 1;
      break;
    case 6:
      vertexCount = 4;
      local_48 = 1;
      break;
    case 7:
      local_48 = 1;
      break;
    case 8:
      vertexCount = 6;
      break;
    case 9:
      vertexCount = 2;
    }
    name.field_2._12_4_ = vertexCount * offset + local_48;
    de::toString<unsigned_int>((string *)local_70,&offset);
    switch(primitiveCountIdx) {
    case 0:
      local_80 = de::Random::getInt((Random *)&testCtx,0,offset);
      uVar2 = rnd.m_rnd._8_8_;
      local_84 = vertexCount * local_80;
      this = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawParams> *)operator_new(0xe0);
      pTVar1 = _topology;
      vertexOffset._3_1_ = 1;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::DrawParams::DrawParams
                ((DrawParams *)&firstIndex,primitives,name.field_2._12_4_,1,local_84,0);
      anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawParams>::DrawTestCase
                (this,pTVar1,pcVar4,"vkCmdDraw testcase.",(DrawParams *)&firstIndex);
      vertexOffset._3_1_ = 0;
      tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)this);
      anon_unknown_0::DrawParams::~DrawParams((DrawParams *)&firstIndex);
      break;
    case 1:
      local_c0 = de::Random::getInt((Random *)&testCtx,0,1000);
      local_c4 = de::Random::getInt((Random *)&testCtx,0,1000);
      uVar2 = rnd.m_rnd._8_8_;
      this_00 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *)
                operator_new(0x100);
      pTVar1 = _topology;
      params.commands.
      super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::DrawIndexedParams::DrawIndexedParams
                ((DrawIndexedParams *)&firstVertex_1,primitives,VK_INDEX_TYPE_UINT32,
                 name.field_2._12_4_,1,local_c0,local_c4,0);
      anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
      DrawTestCase(this_00,pTVar1,pcVar4,"vkCmdDrawIndexed testcase.",
                   (DrawIndexedParams *)&firstVertex_1);
      params.commands.
      super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)this_00);
      anon_unknown_0::DrawIndexedParams::~DrawIndexedParams((DrawIndexedParams *)&firstVertex_1);
      break;
    case 2:
      params.commands.
      super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           de::Random::getInt((Random *)&testCtx,0,1000);
      anon_unknown_0::DrawIndirectParams::DrawIndirectParams
                ((DrawIndirectParams *)local_158,primitives);
      anon_unknown_0::DrawIndirectParams::addCommand
                ((DrawIndirectParams *)local_158,name.field_2._12_4_,1,0,0);
      uVar2 = rnd.m_rnd._8_8_;
      pDVar5 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *)
               operator_new(0xe8);
      pTVar1 = _topology;
      local_1b1 = 1;
      std::operator+(&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "_single_command");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::DrawIndirectParams::DrawIndirectParams
                (&local_1b0,(DrawIndirectParams *)local_158);
      anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
      DrawTestCase(pDVar5,pTVar1,pcVar4,"vkCmdDrawIndirect testcase.",&local_1b0);
      local_1b1 = 0;
      tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pDVar5);
      anon_unknown_0::DrawIndirectParams::~DrawIndirectParams(&local_1b0);
      std::__cxx11::string::~string((string *)&local_178);
      anon_unknown_0::DrawIndirectParams::addCommand
                ((DrawIndirectParams *)local_158,name.field_2._12_4_,1,
                 (deUint32)
                 params.commands.
                 super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      uVar2 = rnd.m_rnd._8_8_;
      pDVar5 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *)
               operator_new(0xe8);
      pTVar1 = _topology;
      std::operator+(&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "_multi_command");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::DrawIndirectParams::DrawIndirectParams
                ((DrawIndirectParams *)&firstIndex_1,(DrawIndirectParams *)local_158);
      anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
      DrawTestCase(pDVar5,pTVar1,pcVar4,"vkCmdDrawIndirect testcase.",
                   (DrawIndirectParams *)&firstIndex_1);
      tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pDVar5);
      anon_unknown_0::DrawIndirectParams::~DrawIndirectParams((DrawIndirectParams *)&firstIndex_1);
      std::__cxx11::string::~string((string *)&local_1d8);
      anon_unknown_0::DrawIndirectParams::~DrawIndirectParams((DrawIndirectParams *)local_158);
      break;
    case 3:
      dVar3 = de::Random::getInt((Random *)&testCtx,name.field_2._12_4_,1000);
      params_1.commands.
      super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           de::Random::getInt((Random *)&testCtx,name.field_2._12_4_,1000);
      anon_unknown_0::DrawIndexedIndirectParams::DrawIndexedIndirectParams
                ((DrawIndexedIndirectParams *)local_278,primitives,VK_INDEX_TYPE_UINT32);
      anon_unknown_0::DrawIndexedIndirectParams::addCommand
                ((DrawIndexedIndirectParams *)local_278,name.field_2._12_4_,1,0,0,0);
      uVar2 = rnd.m_rnd._8_8_;
      pDVar6 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *)
               operator_new(0x108);
      pTVar1 = _topology;
      local_2f1 = 1;
      std::operator+(&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "_single_command");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::DrawIndexedIndirectParams::DrawIndexedIndirectParams
                (&local_2f0,(DrawIndexedIndirectParams *)local_278);
      anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::
      DrawTestCase(pDVar6,pTVar1,pcVar4,"vkCmdDrawIndexedIndirect testcase.",&local_2f0);
      local_2f1 = 0;
      tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pDVar6);
      anon_unknown_0::DrawIndexedIndirectParams::~DrawIndexedIndirectParams(&local_2f0);
      std::__cxx11::string::~string((string *)&local_298);
      anon_unknown_0::DrawIndexedIndirectParams::addCommand
                ((DrawIndexedIndirectParams *)local_278,name.field_2._12_4_,1,dVar3,
                 params_1.commands.
                 super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0);
      uVar2 = rnd.m_rnd._8_8_;
      pDVar6 = (DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *)
               operator_new(0x108);
      pTVar1 = _topology;
      std::operator+(&local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "_multi_command");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      anon_unknown_0::DrawIndexedIndirectParams::DrawIndexedIndirectParams
                (&local_370,(DrawIndexedIndirectParams *)local_278);
      anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::
      DrawTestCase(pDVar6,pTVar1,pcVar4,"vkCmdDrawIndexedIndirect testcase.",&local_370);
      tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pDVar6);
      anon_unknown_0::DrawIndexedIndirectParams::~DrawIndexedIndirectParams(&local_370);
      std::__cxx11::string::~string((string *)&local_318);
      anon_unknown_0::DrawIndexedIndirectParams::~DrawIndexedIndirectParams
                ((DrawIndexedIndirectParams *)local_278);
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  de::Random::~Random((Random *)&testCtx);
  return;
}

Assistant:

void populateSubGroup (tcu::TestCaseGroup* testGroup, const TestCaseParams caseParams)
{
	de::Random						rnd			(SEED ^ deStringHash(testGroup->getName()));
	tcu::TestContext&				testCtx		= testGroup->getTestContext();
	const DrawCommandType			command		= caseParams.command;
	const vk::VkPrimitiveTopology	topology	= caseParams.topology;

	for (deUint32 primitiveCountIdx = 0; primitiveCountIdx < DE_LENGTH_OF_ARRAY(PRIMITIVE_COUNT); ++primitiveCountIdx)
	{
		const deUint32 primitives = PRIMITIVE_COUNT[primitiveCountIdx];

		deUint32	multiplier	= 1;
		deUint32	offset		= 0;
		// Calculated by Vulkan 23.1
		switch (topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:													break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:						multiplier = 2;				break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:													break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:					multiplier = 3;				break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:												break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:									offset = 1;	break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:		multiplier = 4;	offset = 1;	break;
			case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:						offset = 1;	break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:	multiplier = 6;				break;
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:	multiplier = 2;				break;
			default:														DE_FATAL("Unsupported topology.");
		}

		const deUint32	vertexCount		= multiplier * primitives + offset;
		std::string		name			= de::toString(primitives);

		switch (command)
		{
			case DRAW_COMMAND_TYPE_DRAW:
			{
				deUint32	firstPrimitive	= rnd.getInt(0, primitives);
				deUint32	firstVertex		= multiplier * firstPrimitive;
				testGroup->addChild(new DrawCase(testCtx, name.c_str(), "vkCmdDraw testcase.",
					DrawParams(topology, vertexCount, 1, firstVertex, 0))
				);
				break;
			}
			case DRAW_COMMAND_TYPE_DRAW_INDEXED:
			{
				deUint32	firstIndex			= rnd.getInt(0, OFFSET_LIMIT);
				deUint32	vertexOffset		= rnd.getInt(0, OFFSET_LIMIT);
				testGroup->addChild(new IndexedCase(testCtx, name.c_str(), "vkCmdDrawIndexed testcase.",
					DrawIndexedParams(topology, vk::VK_INDEX_TYPE_UINT32, vertexCount, 1, firstIndex, vertexOffset, 0))
				);
				break;
			}
			case DRAW_COMMAND_TYPE_DRAW_INDIRECT:
			{
				deUint32	firstVertex		= rnd.getInt(0, OFFSET_LIMIT);

				DrawIndirectParams	params	= DrawIndirectParams(topology);

				params.addCommand(vertexCount, 1, 0, 0);
				testGroup->addChild(new IndirectCase(testCtx, (name + "_single_command").c_str(), "vkCmdDrawIndirect testcase.", params));

				params.addCommand(vertexCount, 1, firstVertex, 0);
				testGroup->addChild(new IndirectCase(testCtx, (name + "_multi_command").c_str(), "vkCmdDrawIndirect testcase.", params));
				break;
			}
			case DRAW_COMMAND_TYPE_DRAW_INDEXED_INDIRECT:
			{
				deUint32	firstIndex		= rnd.getInt(vertexCount, OFFSET_LIMIT);
				deUint32	vertexOffset	= rnd.getInt(vertexCount, OFFSET_LIMIT);

				DrawIndexedIndirectParams	params	= DrawIndexedIndirectParams(topology, vk::VK_INDEX_TYPE_UINT32);
				params.addCommand(vertexCount, 1, 0, 0, 0);
				testGroup->addChild(new IndexedIndirectCase(testCtx, (name + "_single_command").c_str(), "vkCmdDrawIndexedIndirect testcase.", params));

				params.addCommand(vertexCount, 1, firstIndex, vertexOffset, 0);
				testGroup->addChild(new IndexedIndirectCase(testCtx, (name + "_multi_command").c_str(), "vkCmdDrawIndexedIndirect testcase.", params));
				break;
			}
			default:
				DE_FATAL("Unsupported draw command.");
		}
	}
}